

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void lj_snap_purge(jit_State *J)

{
  uint local_120;
  uint local_11c;
  BCReg maxslot;
  BCReg s;
  uint8_t udf [257];
  jit_State *J_local;
  
  local_120 = J->maxslot;
  if (((*J->pc & 0xff) == 0x5c) && (J->pt->numparams < local_120)) {
    local_120 = (uint)J->pt->numparams;
  }
  unique0x100000c3 = J;
  local_11c = snap_usedef(J,(uint8_t *)&maxslot,J->pc,local_120);
  if (local_11c < local_120) {
    snap_useuv(stack0xfffffffffffffff0->pt,(uint8_t *)&maxslot);
    for (; local_11c < local_120; local_11c = local_11c + 1) {
      if (*(char *)((long)&maxslot + (ulong)local_11c) != '\0') {
        stack0xfffffffffffffff0->base[local_11c] = 0;
      }
    }
  }
  return;
}

Assistant:

void lj_snap_purge(jit_State *J)
{
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg s, maxslot = J->maxslot;
  if (bc_op(*J->pc) == BC_FUNCV && maxslot > J->pt->numparams)
    maxslot = J->pt->numparams;
  s = snap_usedef(J, udf, J->pc, maxslot);
  if (s < maxslot) {
    snap_useuv(J->pt, udf);
    for (; s < maxslot; s++)
      if (udf[s] != 0)
	J->base[s] = 0;  /* Purge dead slots. */
  }
}